

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O0

size_t sse4_despace_trail(char *bytes,size_t howmany)

{
  char cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined8 uVar9;
  uint uVar10;
  undefined1 (*pauVar11) [16];
  int local_200;
  char c;
  int k;
  int mask16;
  __m128i anywhite;
  __m128i xcarriage;
  __m128i xnewline;
  __m128i xspaces;
  __m128i x;
  ulong local_1a0;
  size_t i;
  __m128i carriage;
  __m128i newline;
  __m128i spaces;
  size_t local_160;
  size_t pos;
  size_t howmany_local;
  char *bytes_local;
  
  local_160 = 0;
  auVar4 = vpinsrb_avx(ZEXT116(0x20),0x20,1);
  auVar4 = vpinsrb_avx(auVar4,0x20,2);
  auVar4 = vpinsrb_avx(auVar4,0x20,3);
  auVar4 = vpinsrb_avx(auVar4,0x20,4);
  auVar4 = vpinsrb_avx(auVar4,0x20,5);
  auVar4 = vpinsrb_avx(auVar4,0x20,6);
  auVar4 = vpinsrb_avx(auVar4,0x20,7);
  auVar4 = vpinsrb_avx(auVar4,0x20,8);
  auVar4 = vpinsrb_avx(auVar4,0x20,9);
  auVar4 = vpinsrb_avx(auVar4,0x20,10);
  auVar4 = vpinsrb_avx(auVar4,0x20,0xb);
  auVar4 = vpinsrb_avx(auVar4,0x20,0xc);
  auVar4 = vpinsrb_avx(auVar4,0x20,0xd);
  auVar4 = vpinsrb_avx(auVar4,0x20,0xe);
  auVar4 = vpinsrb_avx(auVar4,0x20,0xf);
  auVar5 = vpinsrb_avx(ZEXT116(10),10,1);
  auVar5 = vpinsrb_avx(auVar5,10,2);
  auVar5 = vpinsrb_avx(auVar5,10,3);
  auVar5 = vpinsrb_avx(auVar5,10,4);
  auVar5 = vpinsrb_avx(auVar5,10,5);
  auVar5 = vpinsrb_avx(auVar5,10,6);
  auVar5 = vpinsrb_avx(auVar5,10,7);
  auVar5 = vpinsrb_avx(auVar5,10,8);
  auVar5 = vpinsrb_avx(auVar5,10,9);
  auVar5 = vpinsrb_avx(auVar5,10,10);
  auVar5 = vpinsrb_avx(auVar5,10,0xb);
  auVar5 = vpinsrb_avx(auVar5,10,0xc);
  auVar5 = vpinsrb_avx(auVar5,10,0xd);
  auVar5 = vpinsrb_avx(auVar5,10,0xe);
  auVar5 = vpinsrb_avx(auVar5,10,0xf);
  auVar6 = vpinsrb_avx(ZEXT116(0xd),0xd,1);
  auVar6 = vpinsrb_avx(auVar6,0xd,2);
  auVar6 = vpinsrb_avx(auVar6,0xd,3);
  auVar6 = vpinsrb_avx(auVar6,0xd,4);
  auVar6 = vpinsrb_avx(auVar6,0xd,5);
  auVar6 = vpinsrb_avx(auVar6,0xd,6);
  auVar6 = vpinsrb_avx(auVar6,0xd,7);
  auVar6 = vpinsrb_avx(auVar6,0xd,8);
  auVar6 = vpinsrb_avx(auVar6,0xd,9);
  auVar6 = vpinsrb_avx(auVar6,0xd,10);
  auVar6 = vpinsrb_avx(auVar6,0xd,0xb);
  auVar6 = vpinsrb_avx(auVar6,0xd,0xc);
  auVar6 = vpinsrb_avx(auVar6,0xd,0xd);
  auVar6 = vpinsrb_avx(auVar6,0xd,0xe);
  auVar6 = vpinsrb_avx(auVar6,0xd,0xf);
  for (local_1a0 = 0; local_1a0 + 0xf < howmany; local_1a0 = local_1a0 + 0x10) {
    pauVar11 = (undefined1 (*) [16])(bytes + local_1a0);
    uVar9 = *(undefined8 *)(*pauVar11 + 8);
    auVar2 = vpcmpeqb_avx(*pauVar11,auVar4);
    auVar3 = vpcmpeqb_avx(*pauVar11,auVar5);
    uVar7 = vpcmpeqb_avx512vl(*pauVar11,auVar6);
    auVar8 = vpmovm2b_avx512vl(uVar7);
    auVar2 = vpor_avx(auVar2,auVar3);
    auVar2 = vpor_avx(auVar2,auVar8);
    uVar10 = (uint)(ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar2[0xf] >> 7) << 0xf);
    if (uVar10 == 0) {
      *(undefined8 *)(bytes + local_160) = *(undefined8 *)*pauVar11;
      *(undefined8 *)(bytes + local_160 + 8) = uVar9;
      local_160 = local_160 + 0x10;
    }
    else {
      for (local_200 = 0; local_200 < 0x10; local_200 = local_200 + 1) {
        if ((uVar10 & 1 << ((byte)local_200 & 0x1f)) == 0) {
          bytes[local_160] = bytes[local_1a0 + (long)local_200];
          local_160 = local_160 + 1;
        }
      }
    }
  }
  for (; local_1a0 < howmany; local_1a0 = local_1a0 + 1) {
    cVar1 = bytes[local_1a0];
    if (((cVar1 != '\r') && (cVar1 != '\n')) && (cVar1 != ' ')) {
      bytes[local_160] = cVar1;
      local_160 = local_160 + 1;
    }
  }
  return local_160;
}

Assistant:

size_t sse4_despace_trail(char *bytes, size_t howmany) {
  size_t pos = 0;
  __m128i spaces = _mm_set1_epi8(' ');
  __m128i newline = _mm_set1_epi8('\n');
  __m128i carriage = _mm_set1_epi8('\r');
  size_t i = 0;
  for (; i + 15 < howmany; i += 16) {
    __m128i x = _mm_loadu_si128((const __m128i *)(bytes + i));
    // we do it the naive way, could be smarter?
    __m128i xspaces = _mm_cmpeq_epi8(x, spaces);
    __m128i xnewline = _mm_cmpeq_epi8(x, newline);
    __m128i xcarriage = _mm_cmpeq_epi8(x, carriage);
    __m128i anywhite = _mm_or_si128(_mm_or_si128(xspaces, xnewline), xcarriage);
    int mask16 = _mm_movemask_epi8(anywhite);
    if (mask16 == 0) { // no match!
      _mm_storeu_si128((__m128i *)(bytes + pos), x);
      pos += 16;
    } else {
      for (int k = 0; k < 16; ++k) {
        if (mask16 & (1 << k))
          continue;
        bytes[pos++] = bytes[i + k];
      }
    }
  }
  for (; i < howmany; i++) {
    char c = bytes[i];
    if (c == '\r' || c == '\n' || c == ' ') {
      continue;
    }
    bytes[pos++] = c;
  }
  return pos;
}